

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O1

MIR_reg_t to_reg(MIR_context_t ctx,uint64_t reg_str_num,MIR_item_t_conflict func)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  bin_tag_t bVar8;
  MIR_reg_t MVar9;
  reg_desc_t *prVar10;
  ulong uVar11;
  MIR_context_t ctx_00;
  MIR_func_t func_00;
  ulong uVar12;
  char *func_01;
  MIR_context_t ctx_01;
  ulong *__s;
  ulong uVar13;
  ulong uVar14;
  MIR_str_t MVar15;
  token_attr_t tStack_40;
  MIR_context_t pMStack_28;
  MIR_context_t pMStack_20;
  
  pMStack_20 = (MIR_context_t)0x144dd7;
  MVar15 = to_str(ctx,reg_str_num);
  ctx_00 = (MIR_context_t)MVar15.s;
  pMStack_20 = (MIR_context_t)0x144df1;
  process_reserved_name((char *)ctx_00,"t",&((func->u).func)->last_temp_num);
  pMStack_20 = (MIR_context_t)0x144dfd;
  prVar10 = find_rd_by_name(ctx_00,(func->u).import_id,func_00);
  if (prVar10 != (reg_desc_t *)0x0) {
    return prVar10->reg;
  }
  func_01 = "undeclared func reg %s";
  ctx_01 = (MIR_context_t)0xf;
  pMStack_20 = (MIR_context_t)read_reg;
  (*ctx->error_func)(MIR_undeclared_func_reg_error,"undeclared func reg %s",ctx_00);
  pMStack_28 = ctx;
  pMStack_20 = ctx_00;
  bVar8 = read_token(ctx_01,&tStack_40);
  if (0xfffffffb < bVar8 - TAG_NAME1) {
    MVar9 = to_reg(ctx_01,tStack_40.u,(MIR_item_t_conflict)func_01);
    return MVar9;
  }
  __s = (ulong *)&DAT_00000002;
  (*ctx_01->error_func)(MIR_binary_io_error,"register has wrong tag %d",(ulong)bVar8);
  uVar11 = strlen((char *)__s);
  for (uVar13 = uVar11; 0xf < uVar13; uVar13 = uVar13 - 0x10) {
    auVar5._8_8_ = 0;
    auVar5._0_8_ = *__s;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = __s[1];
    uVar11 = SUB168(ZEXT816(0x288eea216831e6a7) * auVar6,8) +
             SUB168(ZEXT816(0x288eea216831e6a7) * auVar6,0) ^
             SUB168(ZEXT816(0x65862b62bdf5ef4d) * auVar5,8) +
             SUB168(ZEXT816(0x65862b62bdf5ef4d) * auVar5,0) ^ uVar11;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar11;
    uVar11 = SUB168(auVar1 * ZEXT816(0x65862b62bdf5ef4d),8) +
             SUB168(auVar1 * ZEXT816(0x65862b62bdf5ef4d),0) ^ uVar11;
    __s = __s + 2;
  }
  if (7 < uVar13) {
    auVar7._8_8_ = 0;
    auVar7._0_8_ = *__s;
    uVar11 = uVar11 ^ SUB168(ZEXT816(0x65862b62bdf5ef4d) * auVar7,8) +
                      SUB168(ZEXT816(0x65862b62bdf5ef4d) * auVar7,0);
    uVar13 = uVar13 - 8;
    __s = __s + 1;
  }
  if (uVar13 != 0) {
    if (uVar13 == 8) {
      uVar12 = *__s;
    }
    else {
      if (uVar13 < 4) {
        uVar14 = 0;
        uVar12 = 0;
      }
      else {
        uVar12 = (ulong)(uint)*__s << 0x20;
        uVar14 = 4;
      }
      if (uVar14 < uVar13) {
        do {
          uVar12 = uVar12 >> 8 | (ulong)*(byte *)((long)__s + uVar14) << 0x38;
          uVar14 = uVar14 + 1;
        } while (uVar13 != uVar14);
      }
    }
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar12;
    uVar11 = uVar11 ^ SUB168(auVar2 * ZEXT816(0x288eea216831e6a7),8) +
                      SUB168(auVar2 * ZEXT816(0x288eea216831e6a7),0);
  }
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar11;
  uVar11 = SUB168(auVar3 * ZEXT816(0x65862b62bdf5ef4d),8) +
           SUB168(auVar3 * ZEXT816(0x65862b62bdf5ef4d),0) ^ uVar11;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar11;
  return (uint)uVar11 ^
         SUB164(auVar4 * ZEXT816(0x288eea216831e6a7),8) +
         SUB164(auVar4 * ZEXT816(0x288eea216831e6a7),0);
}

Assistant:

static MIR_reg_t to_reg (MIR_context_t ctx, uint64_t reg_str_num, MIR_item_t func) {
  const char *s = to_str (ctx, reg_str_num).s;

  process_reserved_name (s, TEMP_REG_NAME_PREFIX, &func->u.func->last_temp_num);
  return MIR_reg (ctx, s, func->u.func);
}